

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StatementList * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StatementList,std::span<slang::ast::Statement_const*const,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,
          span<const_slang::ast::Statement_*const,_18446744073709551615UL> *args,SourceRange *args_1
          )

{
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> list;
  StatementList *pSVar1;
  pointer in_RDX;
  __extent_storage<18446744073709551615UL> in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pSVar1 = (StatementList *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  list._M_extent._M_extent_value = in_RSI._M_extent_value;
  list._M_ptr = in_RDX;
  ast::StatementList::StatementList
            ((StatementList *)in_RDX[1],list,*(SourceRange *)in_RSI._M_extent_value);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }